

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O0

void __thiscall mjs::labelled_statement::~labelled_statement(labelled_statement *this)

{
  labelled_statement *this_local;
  
  ~labelled_statement(this);
  operator_delete(this,0x48);
  return;
}

Assistant:

explicit labelled_statement(const source_extend& extend, const std::wstring& id, statement_ptr&& s) : statement(extend), id_(id), s_(std::move(s)) {
        assert(!id_.empty());
        assert(s_);
    }